

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

void dictionary_text_close(dictionary_t t_dictionary)

{
  undefined8 *puVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  for (uVar2 = 0; uVar2 < *t_dictionary; uVar2 = uVar2 + 1) {
    lVar3 = uVar2 * 0x10;
    free(*(void **)((long)*(void **)((long)t_dictionary + 0x10) + lVar3));
    for (puVar1 = *(undefined8 **)(*(long *)((long)t_dictionary + 0x10) + 8 + lVar3);
        (void *)*puVar1 != (void *)0x0; puVar1 = puVar1 + 1) {
      free((void *)*puVar1);
    }
    free(*(void **)(*(long *)((long)t_dictionary + 0x10) + 8 + lVar3));
  }
  free(*(void **)((long)t_dictionary + 0x10));
  free(*(void **)((long)t_dictionary + 0x18));
  free(t_dictionary);
  return;
}

Assistant:

void dictionary_text_close(dictionary_t t_dictionary)
{
	text_dictionary_desc * text_dictionary = (text_dictionary_desc *) t_dictionary;

	size_t i;
	for (i = 0; i < text_dictionary->entry_count; ++ i)
	{
		free(text_dictionary->lexicon[i].key);

		ucs4_t ** j;
		for (j = text_dictionary->lexicon[i].value; *j; ++ j)
		{
			free(*j);
		}
		free(text_dictionary->lexicon[i].value);
	}

	free(text_dictionary->lexicon);
	free(text_dictionary->word_buff);
	free(text_dictionary);
}